

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O3

FieldGeneratorBase *
google::protobuf::compiler::csharp::CreateFieldGenerator
          (FieldDescriptor *descriptor,int presenceIndex,Options *options)

{
  FieldDescriptor FVar1;
  FieldDescriptor FVar2;
  char cVar3;
  int iVar4;
  FieldGeneratorBase *pFVar5;
  long lVar6;
  PrimitiveFieldGenerator *this;
  WrapperFieldGenerator *this_00;
  csharp local_30 [16];
  
  FVar1 = descriptor[2];
  if ((byte)FVar1 - 10 < 2) {
    FVar2 = descriptor[1];
    if (0xbf < (byte)FVar2 != (bool)(((byte)FVar2 & 0x20) >> 5)) {
      CreateFieldGenerator();
LAB_0023964c:
      CreateFieldGenerator();
LAB_00239661:
      CreateFieldGenerator();
LAB_00239676:
      CreateFieldGenerator(local_30);
LAB_00239680:
      CreateFieldGenerator(local_30);
      goto LAB_0023968a;
    }
    if (((byte)FVar2 & 0x20) != 0) {
      if ((FVar1 == (FieldDescriptor)0xb) &&
         (cVar3 = google::protobuf::FieldDescriptor::is_map_message_type(), cVar3 != '\0')) {
        pFVar5 = (FieldGeneratorBase *)operator_new(0x40);
        MapFieldGenerator::MapFieldGenerator
                  ((MapFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
        return pFVar5;
      }
      pFVar5 = (FieldGeneratorBase *)operator_new(0x40);
      RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                ((RepeatedMessageFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
      return pFVar5;
    }
    if (FVar1 != (FieldDescriptor)0xb) {
LAB_00239428:
      if (-1 < (char)descriptor[3]) {
        pFVar5 = (FieldGeneratorBase *)operator_new(0x40);
        MessageFieldGenerator::MessageFieldGenerator
                  ((MessageFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
        return pFVar5;
      }
      if (((byte)descriptor[1] & 0x10) == 0) goto LAB_0023969e;
      lVar6 = *(long *)(descriptor + 0x28);
      if (lVar6 == 0) {
LAB_002396b6:
        google::protobuf::internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                   ,0xa9a);
      }
      if ((*(int *)(lVar6 + 4) != 1) || ((*(byte *)(*(long *)(lVar6 + 0x30) + 1) & 2) == 0)) {
        pFVar5 = (FieldGeneratorBase *)operator_new(0x40);
        MessageOneofFieldGenerator::MessageOneofFieldGenerator
                  ((MessageOneofFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
        return pFVar5;
      }
      goto LAB_00239676;
    }
    lVar6 = google::protobuf::FieldDescriptor::message_type();
    iVar4 = std::__cxx11::string::compare(*(char **)(*(long *)(lVar6 + 0x10) + 8));
    if (iVar4 != 0) goto LAB_00239428;
    if (-1 < (char)descriptor[3]) {
      this_00 = (WrapperFieldGenerator *)operator_new(0x48);
      WrapperFieldGenerator::WrapperFieldGenerator(this_00,descriptor,presenceIndex,options);
      return &this_00->super_FieldGeneratorBase;
    }
    if (((byte)descriptor[1] & 0x10) == 0) goto LAB_0023969e;
    lVar6 = *(long *)(descriptor + 0x28);
    if (lVar6 == 0) goto LAB_002396b6;
    if ((*(int *)(lVar6 + 4) != 1) || ((*(byte *)(*(long *)(lVar6 + 0x30) + 1) & 2) == 0)) {
      pFVar5 = (FieldGeneratorBase *)operator_new(0x48);
      WrapperOneofFieldGenerator::WrapperOneofFieldGenerator
                ((WrapperOneofFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
      return pFVar5;
    }
  }
  else {
    if (FVar1 == (FieldDescriptor)0xe) {
      FVar1 = descriptor[1];
      if (0xbf < (byte)FVar1 != (bool)(((byte)FVar1 & 0x20) >> 5)) goto LAB_0023964c;
      if (((byte)FVar1 & 0x20) != 0) {
        pFVar5 = (FieldGeneratorBase *)operator_new(0x40);
        RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                  ((RepeatedEnumFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
        return pFVar5;
      }
      if (-1 < (char)descriptor[3]) {
        pFVar5 = (FieldGeneratorBase *)operator_new(0x48);
        EnumFieldGenerator::EnumFieldGenerator
                  ((EnumFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
        return pFVar5;
      }
      if (((byte)FVar1 & 0x10) == 0) goto LAB_0023969e;
      lVar6 = *(long *)(descriptor + 0x28);
      if (lVar6 == 0) goto LAB_002396b6;
      if ((*(int *)(lVar6 + 4) != 1) || ((*(byte *)(*(long *)(lVar6 + 0x30) + 1) & 2) == 0)) {
        pFVar5 = (FieldGeneratorBase *)operator_new(0x48);
        EnumOneofFieldGenerator::EnumOneofFieldGenerator
                  ((EnumOneofFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
        return pFVar5;
      }
      goto LAB_00239680;
    }
    FVar1 = descriptor[1];
    if (0xbf < (byte)FVar1 != (bool)(((byte)FVar1 & 0x20) >> 5)) goto LAB_00239661;
    if (((byte)FVar1 & 0x20) != 0) {
      pFVar5 = (FieldGeneratorBase *)operator_new(0x40);
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                ((RepeatedPrimitiveFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
      return pFVar5;
    }
    if (-1 < (char)descriptor[3]) {
      this = (PrimitiveFieldGenerator *)operator_new(0x48);
      PrimitiveFieldGenerator::PrimitiveFieldGenerator(this,descriptor,presenceIndex,options);
      return &this->super_FieldGeneratorBase;
    }
    if (((byte)FVar1 & 0x10) == 0) goto LAB_0023969e;
    lVar6 = *(long *)(descriptor + 0x28);
    if (lVar6 == 0) goto LAB_002396b6;
    if ((*(int *)(lVar6 + 4) != 1) || ((*(byte *)(*(long *)(lVar6 + 0x30) + 1) & 2) == 0)) {
      pFVar5 = (FieldGeneratorBase *)operator_new(0x48);
      PrimitiveOneofFieldGenerator::PrimitiveOneofFieldGenerator
                ((PrimitiveOneofFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
      return pFVar5;
    }
LAB_0023968a:
    CreateFieldGenerator(local_30);
  }
  CreateFieldGenerator(local_30);
LAB_0023969e:
  google::protobuf::internal::protobuf_assumption_failed
            ("res != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
             ,0xac6);
}

Assistant:

FieldGeneratorBase* CreateFieldGenerator(const FieldDescriptor* descriptor,
                                         int presenceIndex,
                                         const Options* options) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
      if (descriptor->is_repeated()) {
        if (descriptor->is_map()) {
          return new MapFieldGenerator(descriptor, presenceIndex, options);
        } else {
          return new RepeatedMessageFieldGenerator(descriptor, presenceIndex,
                                                   options);
        }
      } else {
        if (IsWrapperType(descriptor)) {
          if (descriptor->real_containing_oneof()) {
            return new WrapperOneofFieldGenerator(descriptor, presenceIndex,
                                                  options);
          } else {
            return new WrapperFieldGenerator(descriptor, presenceIndex,
                                             options);
          }
        } else {
          if (descriptor->real_containing_oneof()) {
            return new MessageOneofFieldGenerator(descriptor, presenceIndex,
                                                  options);
          } else {
            return new MessageFieldGenerator(descriptor, presenceIndex,
                                             options);
          }
        }
      }
    case FieldDescriptor::TYPE_ENUM:
      if (descriptor->is_repeated()) {
        return new RepeatedEnumFieldGenerator(descriptor, presenceIndex,
                                              options);
      } else {
        if (descriptor->real_containing_oneof()) {
          return new EnumOneofFieldGenerator(descriptor, presenceIndex,
                                             options);
        } else {
          return new EnumFieldGenerator(descriptor, presenceIndex, options);
        }
      }
    default:
      if (descriptor->is_repeated()) {
        return new RepeatedPrimitiveFieldGenerator(descriptor, presenceIndex,
                                                   options);
      } else {
        if (descriptor->real_containing_oneof()) {
          return new PrimitiveOneofFieldGenerator(descriptor, presenceIndex,
                                                  options);
        } else {
          return new PrimitiveFieldGenerator(descriptor, presenceIndex,
                                             options);
        }
      }
  }
}